

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTable.cpp
# Opt level: O1

void QTable::Load(string *filename,size_t nrRows,size_t nrColumns,QTable *Q)

{
  ulong uVar1;
  ulong uVar2;
  size_type sVar3;
  char cVar4;
  unsigned_long __tmp_1;
  ostream *poVar5;
  double *pdVar6;
  istream *piVar7;
  undefined8 *puVar8;
  size_t sVar9;
  size_t sVar10;
  pointer pdVar11;
  double *pdVar12;
  size_type i1;
  ulong uVar13;
  size_type i2;
  ulong uVar14;
  long lVar15;
  string buffer;
  double q;
  istringstream is;
  ifstream fp;
  size_t local_3f8;
  undefined1 *local_3e8;
  undefined8 local_3e0;
  undefined1 local_3d8;
  undefined7 uStack_3d7;
  size_t local_3c8;
  undefined8 local_3c0;
  size_t local_3b8;
  size_t local_3b0;
  new_allocator<double> local_3a8 [8];
  size_type local_3a0;
  double *local_398;
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream((istream *)local_238,(filename->_M_dataplus)._M_p,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"QTable::Load: failed to ",0x18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"open file ",10);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(filename->_M_dataplus)._M_p,
                        filename->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  local_3a0 = nrColumns * nrRows;
  local_3c8 = nrRows;
  local_3b8 = nrRows;
  local_3b0 = nrColumns;
  if (local_3a0 == 0) {
    pdVar6 = (double *)0x0;
  }
  else {
    pdVar6 = __gnu_cxx::new_allocator<double>::allocate(local_3a8,local_3a0,(void *)0x0);
  }
  uVar1 = (Q->super_matrix_t).size1_;
  uVar2 = (Q->super_matrix_t).size2_;
  sVar9 = local_3b8;
  if (uVar1 < local_3b8) {
    sVar9 = uVar1;
  }
  sVar10 = local_3b0;
  if (uVar2 < local_3b0) {
    sVar10 = uVar2;
  }
  if (sVar9 != 0) {
    pdVar11 = (Q->super_matrix_t).data_.data_;
    uVar13 = 0;
    pdVar12 = pdVar6;
    do {
      if (sVar10 != 0) {
        uVar14 = 0;
        do {
          pdVar12[uVar14] = pdVar11[uVar14];
          uVar14 = uVar14 + 1;
        } while (sVar10 != uVar14);
      }
      uVar13 = uVar13 + 1;
      pdVar12 = pdVar12 + local_3b0;
      pdVar11 = pdVar11 + uVar2;
    } while (uVar13 != sVar9);
  }
  local_398 = pdVar6;
  if ((matrix_t *)&local_3b8 != &Q->super_matrix_t) {
    (Q->super_matrix_t).size1_ = local_3b8;
    (Q->super_matrix_t).size2_ = local_3b0;
    sVar3 = (Q->super_matrix_t).data_.size_;
    (Q->super_matrix_t).data_.size_ = local_3a0;
    local_398 = (Q->super_matrix_t).data_.data_;
    (Q->super_matrix_t).data_.data_ = pdVar6;
    local_3b8 = uVar1;
    local_3b0 = uVar2;
    local_3a0 = sVar3;
  }
  if (local_3a0 != 0) {
    operator_delete(local_398,local_3a0 << 3);
  }
  local_3e8 = &local_3d8;
  local_3e0 = 0;
  local_3d8 = 0;
  lVar15 = 0;
  local_3f8 = 0;
  while( true ) {
    cVar4 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_3e8,cVar4);
    if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 2) != 0) {
      if (local_3f8 == local_3c8) {
        if (local_3e8 != &local_3d8) {
          operator_delete(local_3e8,CONCAT71(uStack_3d7,local_3d8) + 1);
        }
        std::ifstream::~ifstream(local_238);
        return;
      }
      puVar8 = (undefined8 *)__cxa_allocate_exception(0x28);
      *puVar8 = &PTR__E_0059bd80;
      puVar8[1] = puVar8 + 3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(puVar8 + 1),"QTable::Load wrong number of rows","");
      __cxa_throw(puVar8,&E::typeinfo,E::~E);
    }
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&local_3b8,(string *)&local_3e8,_S_in);
    sVar9 = 0;
    while( true ) {
      piVar7 = std::istream::_M_extract<double>((double *)&local_3b8);
      if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
      *(undefined8 *)
       ((long)(Q->super_matrix_t).data_.data_ + sVar9 * 8 + (Q->super_matrix_t).size2_ * lVar15) =
           local_3c0;
      sVar9 = sVar9 + 1;
    }
    if (nrColumns != sVar9) break;
    local_3f8 = local_3f8 + 1;
    std::__cxx11::istringstream::~istringstream((istringstream *)&local_3b8);
    std::ios_base::~ios_base(local_340);
    lVar15 = lVar15 + 8;
  }
  puVar8 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar8 = &PTR__E_0059bd80;
  puVar8[1] = puVar8 + 3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(puVar8 + 1),"QTable::Load wrong number of columns","");
  __cxa_throw(puVar8,&E::typeinfo,E::~E);
}

Assistant:

void QTable::Load(const std::string &filename,
                  size_t nrRows,
                  size_t nrColumns,
                  QTable &Q)
{
    ifstream fp(filename.c_str());
    if(!fp)
    {
        cerr << "QTable::Load: failed to "
             << "open file " << filename << endl;            
    }

    size_t a,s;
    double q;

//    QTable Q(nrRows,nrColumns);
    try { 
        Q.resize(nrRows,nrColumns);
    }
    catch(std::bad_alloc &e)
    {
        cout << "QTable::Load ran out of memory resizing QTable" << endl;
        throw(e);
    }

    s=0;
    string buffer;
    while(!getline(fp,buffer).eof())
    {
        istringstream is(buffer);
        a=0;
        while(is >> q)
            Q(s,a++)=q;

        if(a!=nrColumns)
            throw(E("QTable::Load wrong number of columns"));

        s++;
    }
    
    if(s!=nrRows)
        throw(E("QTable::Load wrong number of rows"));
}